

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_dwt_interleave_partial_h
               (OPJ_INT32 *dest,OPJ_INT32 cas,opj_sparse_array_int32_t *sa,OPJ_UINT32 sa_line,
               OPJ_UINT32 sn,OPJ_UINT32 win_l_x0,OPJ_UINT32 win_l_x1,OPJ_UINT32 win_h_x0,
               OPJ_UINT32 win_h_x1)

{
  OPJ_BOOL OVar1;
  OPJ_BOOL ret;
  OPJ_UINT32 win_l_x0_local;
  OPJ_UINT32 sn_local;
  OPJ_UINT32 sa_line_local;
  opj_sparse_array_int32_t *sa_local;
  OPJ_INT32 cas_local;
  OPJ_INT32 *dest_local;
  
  OVar1 = opj_sparse_array_int32_read
                    (sa,win_l_x0,sa_line,win_l_x1,sa_line + 1,
                     dest + (long)cas + (ulong)(win_l_x0 << 1),2,0,1);
  if (OVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                  ,0x617,
                  "void opj_dwt_interleave_partial_h(OPJ_INT32 *, OPJ_INT32, opj_sparse_array_int32_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
                 );
  }
  OVar1 = opj_sparse_array_int32_read
                    (sa,sn + win_h_x0,sa_line,sn + win_h_x1,sa_line + 1,
                     dest + (((ulong)(win_h_x0 << 1) + 1) - (long)cas),2,0,1);
  if (OVar1 != 0) {
    return;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                ,0x61d,
                "void opj_dwt_interleave_partial_h(OPJ_INT32 *, OPJ_INT32, opj_sparse_array_int32_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
               );
}

Assistant:

static void opj_dwt_interleave_partial_h(OPJ_INT32 *dest,
        OPJ_INT32 cas,
        opj_sparse_array_int32_t* sa,
        OPJ_UINT32 sa_line,
        OPJ_UINT32 sn,
        OPJ_UINT32 win_l_x0,
        OPJ_UINT32 win_l_x1,
        OPJ_UINT32 win_h_x0,
        OPJ_UINT32 win_h_x1)
{
    OPJ_BOOL ret;
    ret = opj_sparse_array_int32_read(sa,
                                      win_l_x0, sa_line,
                                      win_l_x1, sa_line + 1,
                                      dest + cas + 2 * win_l_x0,
                                      2, 0, OPJ_TRUE);
    assert(ret);
    ret = opj_sparse_array_int32_read(sa,
                                      sn + win_h_x0, sa_line,
                                      sn + win_h_x1, sa_line + 1,
                                      dest + 1 - cas + 2 * win_h_x0,
                                      2, 0, OPJ_TRUE);
    assert(ret);
    OPJ_UNUSED(ret);
}